

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

void __thiscall
unodb::detail::
basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::operator()(basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *this,leaf_type *to_delete)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = to_delete->key_size;
  uVar2 = to_delete->value_size;
  free(to_delete);
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::decrement_leaf_count(this->db,(ulong)uVar1 + (ulong)uVar2 + 0xb);
  return;
}

Assistant:

inline void basic_db_leaf_deleter<Db>::operator()(
    leaf_type *to_delete) const noexcept {
#ifdef UNODB_DETAIL_WITH_STATS
  const auto leaf_size = to_delete->get_size();
#endif  // UNODB_DETAIL_WITH_STATS

  free_aligned(to_delete);

#ifdef UNODB_DETAIL_WITH_STATS
  db.decrement_leaf_count(leaf_size);
#endif  // UNODB_DETAIL_WITH_STATS
}